

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
llb_buildsystem_command_interface_spawn::ForwardingProcessDelegate::processHadError(llbuild::basic::
ProcessContext*,llbuild::basic::ProcessHandle,llvm::Twine_const__
          (void *this,ProcessContext *ctx,ProcessHandle handle,Twine *message)

{
  string errStr;
  llb_data_t err;
  string local_40;
  size_type local_20;
  pointer local_18;
  
  if (*(long *)((long)this + 8) != 0) {
    llvm::Twine::str_abi_cxx11_(&local_40,message);
    local_20 = local_40._M_string_length;
    local_18 = local_40._M_dataplus._M_p;
    (*(code *)(*(undefined8 **)((long)this + 8))[2])(**(undefined8 **)((long)this + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

virtual void processHadError(ProcessContext* ctx, ProcessHandle handle,
                                 const Twine& message) {
      if (delegate != NULL) {
        auto errStr = message.str();
        llb_data_t err{ errStr.size(), (const uint8_t*) errStr.data() };
        delegate->process_had_error(delegate->context, &err);
      }
    }